

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O0

ECDSA_SIG * ECDSA_do_sign(uchar *dgst,int dgst_len,EC_KEY *eckey)

{
  int iVar1;
  undefined4 in_register_00000034;
  size_t local_c0;
  size_t sig_len;
  uint8_t sig [132];
  EC_KEY *eckey_local;
  size_t digest_len_local;
  uint8_t *digest_local;
  
  iVar1 = ecdsa_sign_fixed(dgst,CONCAT44(in_register_00000034,dgst_len),(uint8_t *)&sig_len,
                           &local_c0,0x84,(EC_KEY *)eckey);
  if (iVar1 == 0) {
    digest_local = (uint8_t *)0x0;
  }
  else {
    digest_local = (uint8_t *)ecdsa_sig_from_fixed((EC_KEY *)eckey,(uint8_t *)&sig_len,local_c0);
  }
  return (ECDSA_SIG *)digest_local;
}

Assistant:

ECDSA_SIG *ECDSA_do_sign(const uint8_t *digest, size_t digest_len,
                         const EC_KEY *eckey) {
  uint8_t sig[ECDSA_MAX_FIXED_LEN];
  size_t sig_len;
  if (!ecdsa_sign_fixed(digest, digest_len, sig, &sig_len, sizeof(sig),
                        eckey)) {
    return NULL;
  }

  return ecdsa_sig_from_fixed(eckey, sig, sig_len);
}